

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# split.cpp
# Opt level: O0

void __thiscall
SplitOnceTest_random_view_Test<unsigned_char>::TestBody
          (SplitOnceTest_random_view_Test<unsigned_char> *this)

{
  bool bVar1;
  reference rhs;
  char *pcVar2;
  uchar *in_delim;
  AssertHelper local_108 [8];
  Message local_100 [8];
  basic_string<unsigned_char,_std::char_traits<unsigned_char>,_std::allocator<unsigned_char>_>
  local_f8;
  undefined1 local_d8 [8];
  AssertionResult gtest_ar_1;
  Message local_c0 [8];
  undefined1 local_b8 [8];
  AssertionResult gtest_ar;
  undefined1 local_98 [8];
  pair<std::basic_string_view<unsigned_char,_std::char_traits<unsigned_char>_>,_std::basic_string_view<unsigned_char,_std::char_traits<unsigned_char>_>_>
  split_result;
  RandomTestData<unsigned_char,_std::__cxx11::basic_string<unsigned_char,_std::char_traits<unsigned_char>,_std::allocator<unsigned_char>_>_>
  data;
  SplitOnceTest_random_view_Test<unsigned_char> *this_local;
  
  in_delim = (uchar *)0x0;
  data.m_tokens.
  super__Vector_base<std::__cxx11::basic_string<unsigned_char,_std::char_traits<unsigned_char>,_std::allocator<unsigned_char>_>,_std::allocator<std::__cxx11::basic_string<unsigned_char,_std::char_traits<unsigned_char>,_std::allocator<unsigned_char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)this;
  RandomTestData<unsigned_char,_std::__cxx11::basic_string<unsigned_char,_std::char_traits<unsigned_char>,_std::allocator<unsigned_char>_>_>
  ::RandomTestData((RandomTestData<unsigned_char,_std::__cxx11::basic_string<unsigned_char,_std::char_traits<unsigned_char>,_std::allocator<unsigned_char>_>_>
                    *)&split_result.second._M_str,'\0',0,0);
  jessilib::
  split_once_view<,std::__cxx11::basic_string<unsigned_char,std::char_traits<unsigned_char>,std::allocator<unsigned_char>>,unsigned_char>
            ((pair<std::basic_string_view<unsigned_char,_std::char_traits<unsigned_char>_>,_std::basic_string_view<unsigned_char,_std::char_traits<unsigned_char>_>_>
              *)local_98,(jessilib *)&data.m_fixed_word_length,
             (basic_string<unsigned_char,_std::char_traits<unsigned_char>,_std::allocator<unsigned_char>_>
              *)&default_delim<unsigned_char>,in_delim);
  rhs = std::
        vector<std::__cxx11::basic_string<unsigned_char,_std::char_traits<unsigned_char>,_std::allocator<unsigned_char>_>,_std::allocator<std::__cxx11::basic_string<unsigned_char,_std::char_traits<unsigned_char>,_std::allocator<unsigned_char>_>_>_>
        ::operator[]((vector<std::__cxx11::basic_string<unsigned_char,_std::char_traits<unsigned_char>,_std::allocator<unsigned_char>_>,_std::allocator<std::__cxx11::basic_string<unsigned_char,_std::char_traits<unsigned_char>,_std::allocator<unsigned_char>_>_>_>
                      *)((long)&data.m_str.field_2 + 8),0);
  testing::internal::EqHelper::
  Compare<std::basic_string_view<unsigned_char,_std::char_traits<unsigned_char>_>,_std::__cxx11::basic_string<unsigned_char,_std::char_traits<unsigned_char>,_std::allocator<unsigned_char>_>,_nullptr>
            ((EqHelper *)local_b8,"split_result.first","data.m_tokens[0]",
             (basic_string_view<unsigned_char,_std::char_traits<unsigned_char>_> *)local_98,rhs);
  bVar1 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_b8);
  if (!bVar1) {
    testing::Message::Message(local_c0);
    pcVar2 = testing::AssertionResult::failure_message((AssertionResult *)local_b8);
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)&gtest_ar_1.message_,kNonFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_1510/JAJames[P]Jupiter-Bot/src/Jupiter/src/jessilib/src/test/split.cpp"
               ,0x91,pcVar2);
    testing::internal::AssertHelper::operator=((AssertHelper *)&gtest_ar_1.message_,local_c0);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&gtest_ar_1.message_);
    testing::Message::~Message(local_c0);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)local_b8);
  RandomTestData<unsigned_char,_std::__cxx11::basic_string<unsigned_char,_std::char_traits<unsigned_char>,_std::allocator<unsigned_char>_>_>
  ::get_remainder(&local_f8,
                  (RandomTestData<unsigned_char,_std::__cxx11::basic_string<unsigned_char,_std::char_traits<unsigned_char>,_std::allocator<unsigned_char>_>_>
                   *)&split_result.second._M_str,1);
  testing::internal::EqHelper::
  Compare<std::basic_string_view<unsigned_char,_std::char_traits<unsigned_char>_>,_std::__cxx11::basic_string<unsigned_char,_std::char_traits<unsigned_char>,_std::allocator<unsigned_char>_>,_nullptr>
            ((EqHelper *)local_d8,"split_result.second","data.get_remainder(1)",
             (basic_string_view<unsigned_char,_std::char_traits<unsigned_char>_> *)
             &split_result.first._M_str,&local_f8);
  std::__cxx11::
  basic_string<unsigned_char,_std::char_traits<unsigned_char>,_std::allocator<unsigned_char>_>::
  ~basic_string(&local_f8);
  bVar1 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_d8);
  if (!bVar1) {
    testing::Message::Message(local_100);
    pcVar2 = testing::AssertionResult::failure_message((AssertionResult *)local_d8);
    testing::internal::AssertHelper::AssertHelper
              (local_108,kNonFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_1510/JAJames[P]Jupiter-Bot/src/Jupiter/src/jessilib/src/test/split.cpp"
               ,0x92,pcVar2);
    testing::internal::AssertHelper::operator=(local_108,local_100);
    testing::internal::AssertHelper::~AssertHelper(local_108);
    testing::Message::~Message(local_100);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)local_d8);
  RandomTestData<unsigned_char,_std::__cxx11::basic_string<unsigned_char,_std::char_traits<unsigned_char>,_std::allocator<unsigned_char>_>_>
  ::~RandomTestData((RandomTestData<unsigned_char,_std::__cxx11::basic_string<unsigned_char,_std::char_traits<unsigned_char>,_std::allocator<unsigned_char>_>_>
                     *)&split_result.second._M_str);
  return;
}

Assistant:

TYPED_TEST(SplitOnceTest, random_view) {
	RandomTestData<TypeParam> data{};
	std::pair<std::basic_string_view<TypeParam>, std::basic_string_view<TypeParam>> split_result = split_once_view(data.m_str, default_delim<TypeParam>);

	EXPECT_EQ(split_result.first, data.m_tokens[0]);
	EXPECT_EQ(split_result.second, data.get_remainder(1));
}